

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

string * __thiscall
glu::sl::ShaderParser::parseShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderParser *this,char *str)

{
  ostringstream oVar1;
  byte bVar2;
  string *psVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ostringstream *poVar8;
  int iVar9;
  char *pcVar11;
  ostringstream o;
  byte local_349;
  long *local_348;
  uint local_340;
  long local_338 [2];
  string *local_328;
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  int iVar10;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  for (pcVar11 = str + 2; *pcVar11 == ' '; pcVar11 = pcVar11 + 1) {
  }
  if (*pcVar11 == '\r') {
    pcVar11 = pcVar11 + 1;
  }
  poVar8 = (ostringstream *)(pcVar11 + (*pcVar11 == '\n'));
  while( true ) {
    for (; oVar1 = *poVar8, oVar1 == (ostringstream)0x5c; poVar8 = poVar8 + 2) {
      oVar1 = poVar8[1];
      if (oVar1 != (ostringstream)0x0) {
        if (oVar1 == (ostringstream)0x74) {
          local_320[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
        }
        else if (oVar1 == (ostringstream)0x6e) {
          local_320[0] = (ostringstream)0xa;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
        }
        else {
          local_320[0] = oVar1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
        }
      }
    }
    if ((oVar1 == (ostringstream)0x22) && (poVar8[1] == (ostringstream)0x22)) break;
    local_320[0] = oVar1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
    poVar8 = poVar8 + 1;
  }
  std::__cxx11::stringbuf::str();
  if ((int)local_340 < 1) {
    iVar7 = 0;
  }
  else {
    uVar5 = 0;
    iVar7 = 0;
    do {
      bVar2 = *(byte *)((long)local_348 + uVar5);
      if ((0x20 < (ulong)bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
      iVar7 = iVar7 + (uint)(bVar2 == 9) * 3 + 1;
      uVar5 = uVar5 + 1;
    } while ((local_340 & 0x7fffffff) != uVar5);
  }
  local_328 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  if (0 < (int)local_340) {
    bVar4 = true;
    iVar9 = 0;
    iVar6 = 0;
    do {
      bVar2 = *(byte *)((long)local_348 + (long)iVar9);
      iVar10 = iVar9;
      if ((bVar4) && (iVar6 < iVar7)) {
        if (bVar2 < 0xd) {
          if (bVar2 == 9) {
LAB_01967de7:
            iVar6 = iVar6 + (uint)(bVar2 == 9) * 3 + 1;
            goto LAB_01967e53;
          }
          if (bVar2 == 10) goto LAB_01967e23;
        }
        else {
          if (bVar2 == 0xd) goto LAB_01967df8;
          if (bVar2 == 0x20) goto LAB_01967de7;
        }
LAB_01967e3d:
        local_349 = bVar2;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)&local_349,1);
        bVar4 = false;
      }
      else {
        if (bVar2 != 10) {
          if (bVar2 != 0xd) goto LAB_01967e3d;
LAB_01967df8:
          iVar10 = iVar9 + 1;
          if (*(char *)((long)local_348 + (long)iVar10) == '\n') {
            local_349 = 10;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,(char *)&local_349,1);
            iVar6 = 0;
            bVar4 = true;
            goto LAB_01967e53;
          }
        }
LAB_01967e23:
        local_349 = bVar2;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)&local_349,1);
        iVar6 = 0;
        bVar4 = true;
        iVar10 = iVar9;
      }
LAB_01967e53:
      iVar9 = iVar10 + 1;
    } while (iVar9 < (int)local_340);
  }
  psVar3 = local_328;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  if (local_348 != local_338) {
    operator_delete(local_348,local_338[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar3;
}

Assistant:

string ShaderParser::parseShaderSource (const char* str)
{
	const char*		p = str+2;
	ostringstream	o;

	// Eat first empty line from beginning.
	while (*p == ' ') p++;
	if (*p == '\r') p++;
	if (*p == '\n') p++;

	while ((p[0] != '"') || (p[1] != '"'))
	{
		if (*p == '\\')
		{
			switch (p[1])
			{
				case 0:		DE_ASSERT(DE_FALSE);	break;
				case 'n':	o << '\n';				break;
				case 't':	o << '\t';				break;
				default:	o << p[1];				break;
			}

			p += 2;
		}
		else
			o << *p++;
	}

	return removeExtraIndentation(o.str());
}